

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

ModelPtr setupFlattenImportedUnitsThroughComponent(string *baseModelName)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPtr MVar1;
  allocator<char> local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  string local_d8 [32];
  ModelPtr model;
  ComponentPtr ic;
  allocator<char> local_98 [32];
  UnitsPtr u;
  ImportSourcePtr import;
  ImporterPtr importer;
  ModelPtr importModel;
  string local_38 [32];
  
  importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  libcellml::Importer::create(SUB81(&importer,0));
  createBaseModelImport((ModelPtr *)&import,(string *)&importModel);
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"main_model",local_98);
  libcellml::Model::create((string *)&model);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"my_component",local_98);
  libcellml::Component::create((string *)&ic);
  std::__cxx11::string::~string(local_d8);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (ic.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10)
            );
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"my_component",local_98);
  libcellml::ImportedEntity::setImportReference
            ((string *)
             (ic.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10)
            );
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"fmol",local_98);
  libcellml::Units::create((string *)&u);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"mole",&local_d9);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"femto",&local_da);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_db);
  libcellml::Units::addUnit
            ((string *)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_d8,1.0,1.0,(string *)local_98);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_d8);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Importer::flattenModel((shared_ptr *)baseModelName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ic.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)baseModelName;
  return (ModelPtr)MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr setupFlattenImportedUnitsThroughComponent(const std::string &baseModelName)
{
    libcellml::ModelPtr importModel;
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    libcellml::ImportSourcePtr import = createBaseModelImport(importModel, baseModelName);

    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::ComponentPtr ic = libcellml::Component::create("my_component");
    ic->setImportSource(import);
    ic->setImportReference("my_component");

    libcellml::UnitsPtr u = libcellml::Units::create("fmol");
    u->addUnit("mole", "femto");

    model->addComponent(ic);
    model->addUnits(u);

    return importer->flattenModel(model);
}